

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O2

REF_STATUS ref_cloud_push(REF_CLOUD ref_cloud,REF_GLOB global,REF_DBL *aux)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  REF_GLOB *__ptr;
  REF_DBL *__ptr_00;
  uint uVar4;
  ulong uVar5;
  
  iVar3 = ref_cloud->n;
  if (ref_cloud->max == iVar3) {
    ref_cloud->max = ref_cloud->max + 100;
    fflush(_stdout);
    __ptr = ref_cloud->global;
    if (0 < (long)ref_cloud->max) {
      __ptr = (REF_GLOB *)realloc(__ptr,(long)ref_cloud->max << 3);
      ref_cloud->global = __ptr;
    }
    if (__ptr == (REF_GLOB *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x85,
             "ref_cloud_push","realloc ref_cloud->global NULL");
      uVar4 = ref_cloud->max;
    }
    else {
      fflush(_stdout);
      uVar4 = ref_cloud->max * ref_cloud->naux;
      __ptr_00 = ref_cloud->aux;
      if (0 < (int)uVar4) {
        __ptr_00 = (REF_DBL *)realloc(__ptr_00,(ulong)uVar4 << 3);
        ref_cloud->aux = __ptr_00;
      }
      if (__ptr_00 != (REF_DBL *)0x0) {
        iVar3 = ref_cloud->n;
        goto LAB_001f1387;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cloud.c",0x87,
             "ref_cloud_push","realloc ref_cloud->aux NULL");
      uVar4 = ref_cloud->max * ref_cloud->naux;
    }
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar4,(long)(int)uVar4,
           8,(long)(int)uVar4 * 8);
    uVar4 = 2;
  }
  else {
LAB_001f1387:
    ref_cloud->n = iVar3 + 1;
    ref_cloud->global[iVar3] = global;
    uVar1 = ref_cloud->naux;
    uVar4 = 0;
    uVar2 = uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar4;
    }
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      ref_cloud->aux[(long)(int)(iVar3 * uVar1) + uVar5] = aux[uVar5];
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_push(REF_CLOUD ref_cloud, REF_GLOB global,
                                  REF_DBL *aux) {
  REF_INT item, i;

  if (ref_cloud_max(ref_cloud) == ref_cloud_n(ref_cloud)) {
    ref_cloud_max(ref_cloud) += 100;

    ref_realloc(ref_cloud->global, ref_cloud_max(ref_cloud), REF_GLOB);
    ref_realloc(ref_cloud->aux,
                ref_cloud_naux(ref_cloud) * ref_cloud_max(ref_cloud), REF_DBL);
  }

  /* fill */
  item = ref_cloud_n(ref_cloud);
  ref_cloud_n(ref_cloud)++;
  ref_cloud_global(ref_cloud, item) = global;
  each_ref_cloud_aux(ref_cloud, i) {
    ref_cloud_aux(ref_cloud, i, item) = aux[i];
  }

  return REF_SUCCESS;
}